

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.cpp
# Opt level: O2

bool mg::data::mrg_write(Mrg *in,string *hed,string *mrg)

{
  uint uVar1;
  pointer pcVar2;
  pointer pEVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  std::__cxx11::string::resize((ulong)hed);
  pcVar2 = (hed->_M_dataplus)._M_p;
  mrg->_M_string_length = 0;
  *(mrg->_M_dataplus)._M_p = '\0';
  lVar8 = 0;
  uVar5 = 0;
  while( true ) {
    uVar7 = (ulong)uVar5;
    pEVar3 = (in->entries).
             super__Vector_base<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar6 = ((long)(in->entries).
                   super__Vector_base<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pEVar3) / 0x30;
    if (uVar6 <= uVar7) break;
    *(int *)(pcVar2 + uVar7 * 8) = (int)lVar8;
    uVar1 = (uint)pEVar3[uVar7].data._M_string_length;
    sVar4 = ((short)(uVar1 >> 0xb) + 1) - (ushort)((uVar1 & 0x7ff) == 0);
    *(short *)(pcVar2 + uVar7 * 8 + 4) = sVar4;
    if (pEVar3[uVar7].is_compressed == true) {
      uVar1 = (uint)pEVar3[uVar7].uncompressed_size_bytes;
      sVar4 = ((short)(uVar1 >> 0xb) + 1) - (ushort)((uVar1 & 0x7ff) == 0);
    }
    *(short *)(pcVar2 + uVar7 * 8 + 6) = sVar4;
    std::__cxx11::string::resize((ulong)mrg,(char)mrg->_M_string_length);
    pEVar3 = (in->entries).
             super__Vector_base<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>._M_impl
             .super__Vector_impl_data._M_start;
    memcpy((mrg->_M_dataplus)._M_p + lVar8 * 0x800,pEVar3[uVar7].data._M_dataplus._M_p,
           pEVar3[uVar7].data._M_string_length);
    lVar8 = lVar8 + (ulong)*(ushort *)(pcVar2 + uVar7 * 8 + 4);
    uVar5 = uVar5 + 1;
  }
  pcVar2 = pcVar2 + uVar6 * 8;
  pcVar2[0] = -1;
  pcVar2[1] = -1;
  pcVar2[2] = -1;
  pcVar2[3] = -1;
  pcVar2[4] = -1;
  pcVar2[5] = -1;
  pcVar2[6] = -1;
  pcVar2[7] = -1;
  pcVar2[8] = -1;
  pcVar2[9] = -1;
  pcVar2[10] = -1;
  pcVar2[0xb] = -1;
  pcVar2[0xc] = -1;
  pcVar2[0xd] = -1;
  pcVar2[0xe] = -1;
  pcVar2[0xf] = -1;
  return true;
}

Assistant:

bool mrg_write(const Mrg &in, std::string &hed, std::string &mrg) {
  // Work out the total header size
  // Note that there are 2 extra header entries of 0xFF for EOF
  const ssize_t header_size =
      (in.entries.size() + 2) * sizeof(Mrg::PackedEntryHeader);
  hed.resize(header_size);

  // Serialize each entry
  Mrg::PackedEntryHeader *headers =
      reinterpret_cast<Mrg::PackedEntryHeader *>(hed.data());
  ssize_t mrg_write_offset_sectors = 0;
  mrg.clear();
  for (unsigned i = 0; i < in.entries.size(); i++) {
    // Pack header
    headers[i].offset = mrg_write_offset_sectors;
    headers[i].size_sectors = Mrg::size_in_sectors(in.entries[i].data.size());

    // If the entry is compressed, use the correct uncompressed size
    // Else, use the normal size
    if (in.entries[i].is_compressed) {
      headers[i].size_uncompressed_sectors =
          Mrg::size_in_sectors(in.entries[i].uncompressed_size_bytes);
    } else {
      headers[i].size_uncompressed_sectors =
          Mrg::size_in_sectors(in.entries[i].data.size());
    }

    // Copy data
    mrg.resize(mrg.size() + headers[i].size_sectors * Mrg::SECTOR_SIZE, '\0');
    memcpy(&mrg[mrg_write_offset_sectors * Mrg::SECTOR_SIZE],
           in.entries[i].data.data(), in.entries[i].data.size());

    // Increment write offset
    mrg_write_offset_sectors += headers[i].size_sectors;

    // Header to file order
    headers[i].to_file_order();
  }

  // Write EOF on the HED file
  memset(&headers[in.entries.size()], 0xFF, sizeof(Mrg::PackedEntryHeader) * 2);

  return true;
}